

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

int sha3_shake_init(hash_state *md,int num)

{
  int in_ESI;
  void *in_RDI;
  int local_4;
  
  if (in_RDI == (void *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0xad)
    ;
  }
  if ((in_ESI == 0x80) || (in_ESI == 0x100)) {
    memset(in_RDI,0,0x1a0);
    *(short *)((long)in_RDI + 0x19c) = (short)((ulong)(long)(in_ESI << 1) >> 6);
    local_4 = 0;
  }
  else {
    local_4 = 0x10;
  }
  return local_4;
}

Assistant:

int sha3_shake_init(hash_state *md, int num)
{
   LTC_ARGCHK(md != NULL);
   if (num != 128 && num != 256) return CRYPT_INVALID_ARG;
   XMEMSET(&md->sha3, 0, sizeof(md->sha3));
   md->sha3.capacity_words = (unsigned short)(2 * num / (8 * sizeof(ulong64)));
   return CRYPT_OK;
}